

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_info.c
# Opt level: O1

void do_time(CHAR_DATA *ch,char *argument)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char buf [4608];
  
  iVar1 = time_info.day + 1;
  pcVar6 = "th";
  if ((0xe < time_info.day - 4U) && (uVar2 = ~((iVar1 / 10) * 10) + iVar1, uVar2 < 3)) {
    pcVar6 = &DAT_00384608 + *(int *)(&DAT_00384608 + (ulong)uVar2 * 4);
  }
  uVar2 = time_info.hour +
          (((uint)(time_info.hour / 6 + (time_info.hour >> 0x1f)) >> 1) - (time_info.hour >> 0x1f))
          * -0xc;
  uVar3 = 0xc;
  if (uVar2 != 0) {
    uVar3 = (ulong)uVar2;
  }
  pcVar4 = "";
  if (time_info.half) {
    pcVar4 = "half past ";
  }
  pcVar5 = "am";
  if (0xb < time_info.hour) {
    pcVar5 = "pm";
  }
  sprintf(buf,
          "It is %s%d o\'clock %s, Day %s, %d%s of the Month %s.\n\rIt is the Season %s in the Year %d.\n\r"
          ,pcVar4,uVar3,pcVar5,day_name[iVar1 % 6],(long)iVar1,pcVar6,month_name[time_info.month],
          season_name[time_info.season],(ulong)(uint)time_info.year);
  send_to_char(buf,ch);
  pcVar6 = talloc_string(str_boot_time);
  chomp(pcVar6);
  sprintf(buf,"Riftshadow started up at %s.\n\r",pcVar6);
  send_to_char(buf,ch);
  pcVar6 = ctime(&current_time);
  pcVar6 = talloc_string(pcVar6);
  chomp(pcVar6);
  sprintf(buf,"The system time is %s.\n\r",pcVar6);
  send_to_char(buf,ch);
  return;
}

Assistant:

void do_time(CHAR_DATA *ch, char *argument)
{
	char buf[MAX_STRING_LENGTH];
	char *suf;

	auto day = time_info.day + 1;

	if (day > 4 && day < 20)
		suf = "th";
	else if (day % 10 == 1)
		suf = "st";
	else if (day % 10 == 2)
		suf = "nd";
	else if (day % 10 == 3)
		suf = "rd";
	else
		suf = "th";

	sprintf(buf, "It is %s%d o'clock %s, Day %s, %d%s of the Month %s.\n\rIt is the Season %s in the Year %d.\n\r",
		(time_info.half) ? "half past " : "",
		(time_info.hour % 12 == 0) ? 12 : time_info.hour % 12,
		time_info.hour >= 12 ? "pm" : "am",
		day_name[day % 6],
		day,
		suf,
		month_name[time_info.month],
		season_name[time_info.season],
		time_info.year);
	send_to_char(buf, ch);

	auto time = talloc_string(str_boot_time);
	chomp(time);

	sprintf(buf, "Riftshadow started up at %s.\n\r", time);
	send_to_char(buf, ch);

	time = talloc_string(ctime(&current_time));
	chomp(time);

	sprintf(buf, "The system time is %s.\n\r", time);
	send_to_char(buf, ch);
}